

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImFontGlyph *pIVar11;
  ulong uVar12;
  ImFontGlyph *pIVar13;
  uint uVar14;
  char *__function;
  long lVar15;
  float *pfVar16;
  uint uVar17;
  int n;
  ushort uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ushort local_30 [4];
  
  uVar21 = (this->Glyphs).Size;
  if ((ulong)uVar21 == 0) {
    uVar17 = 1;
  }
  else {
    lVar15 = 0;
    uVar14 = 0;
    if (0 < (int)uVar21) {
      uVar14 = uVar21;
    }
    uVar17 = 0;
    do {
      if (uVar14 <= uVar21 - 1) {
        __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
        goto LAB_0015e6f7;
      }
      uVar20 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar15) >> 2;
      if (uVar17 <= uVar20) {
        uVar17 = uVar20;
      }
      lVar15 = lVar15 + 0x28;
    } while ((ulong)uVar21 * 0x28 != lVar15);
    uVar17 = uVar17 + 1;
  }
  if (0xfffe < (int)uVar21) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                  ,0xc54,"void ImFont::BuildLookupTable()");
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar17);
  iVar1 = (this->Glyphs).Size;
  lVar15 = (long)iVar1;
  if (0 < lVar15) {
    pfVar3 = (this->IndexAdvanceX).Data;
    puVar4 = (this->IndexLookup).Data;
    pfVar16 = &((this->Glyphs).Data)->AdvanceX;
    lVar19 = 0;
    do {
      uVar21 = *(uint *)(pfVar16 + -1);
      uVar14 = uVar21 >> 2;
      if ((this->IndexAdvanceX).Size <= (int)uVar14) goto LAB_0015e6b4;
      pfVar3[uVar14] = *pfVar16;
      if ((this->IndexLookup).Size <= (int)uVar14) goto LAB_0015e6cb;
      puVar4[uVar14] = (unsigned_short)lVar19;
      this->Used4kPagesMap[uVar21 >> 0x11] =
           this->Used4kPagesMap[uVar21 >> 0x11] | (byte)(1 << ((byte)(uVar21 >> 0xe) & 7));
      lVar19 = lVar19 + 1;
      pfVar16 = pfVar16 + 10;
    } while (lVar15 != lVar19);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar13 == (ImFontGlyph *)0x0) {
LAB_0015e4a0:
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar13 = *(byte *)pIVar13 & 0xfd;
    }
    if (((uint)(this->IndexLookup).Size < 10) ||
       (uVar18 = (this->IndexLookup).Data[9], uVar18 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar13 = *(byte *)pIVar13 & 0xfd;
    }
    local_30[2] = 0x2026;
    local_30[3] = 0x85;
    local_30[0] = 0x2e;
    local_30[1] = 0xff0e;
    if (this->EllipsisChar == 0xffff) {
      lVar15 = 0;
      do {
        uVar18 = local_30[lVar15 + 2];
        if ((((ulong)uVar18 < (ulong)(long)(this->IndexLookup).Size) &&
            ((this->IndexLookup).Data[uVar18] != 0xffff)) &&
           ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0015e54b;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 2);
      uVar18 = 0xffff;
LAB_0015e54b:
      this->EllipsisChar = uVar18;
    }
    if (this->DotChar == 0xffff) {
      lVar15 = 0;
      do {
        uVar18 = local_30[lVar15];
        if ((((ulong)uVar18 < (ulong)(long)(this->IndexLookup).Size) &&
            ((this->IndexLookup).Data[uVar18] != 0xffff)) &&
           ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0015e58c;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 2);
      uVar18 = 0xffff;
LAB_0015e58c:
      this->DotChar = uVar18;
    }
    uVar12 = (ulong)(this->IndexLookup).Size;
    if (this->FallbackChar < uVar12) {
      uVar18 = (this->IndexLookup).Data[this->FallbackChar];
      pIVar13 = (ImFontGlyph *)0x0;
      if (uVar18 != 0xffff) {
        pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
      }
    }
    else {
      pIVar13 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar13;
    if (pIVar13 == (ImFontGlyph *)0x0) {
      lVar15 = 0;
      do {
        uVar18 = *(ushort *)((long)&DAT_001b7042 + lVar15);
        if (((uVar18 < uVar12) && ((this->IndexLookup).Data[uVar18] != 0xffff)) &&
           ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0015e609;
        lVar15 = lVar15 + 2;
      } while (lVar15 != 6);
      uVar18 = 0xffff;
LAB_0015e609:
      this->FallbackChar = uVar18;
      if (uVar18 < uVar12) {
        uVar18 = (this->IndexLookup).Data[uVar18];
        pIVar13 = (ImFontGlyph *)0x0;
        if (uVar18 != 0xffff) {
          pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
        }
      }
      else {
        pIVar13 = (ImFontGlyph *)0x0;
      }
      this->FallbackGlyph = pIVar13;
      if (pIVar13 == (ImFontGlyph *)0x0) {
        lVar15 = (long)(this->Glyphs).Size;
        if (lVar15 < 1) {
LAB_0015e701:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                        ,0x70f,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
        }
        pIVar13 = (this->Glyphs).Data + lVar15 + -1;
        this->FallbackGlyph = pIVar13;
        this->FallbackChar = (ImWchar)(*(uint *)pIVar13 >> 2);
      }
    }
    pfVar3 = (this->IndexAdvanceX).Data;
    this->FallbackAdvanceX = this->FallbackGlyph->AdvanceX;
    uVar12 = 0;
    while ((long)uVar12 < (long)(this->IndexAdvanceX).Size) {
      pfVar16 = pfVar3 + uVar12;
      if (*pfVar16 <= 0.0 && *pfVar16 != 0.0) {
        pfVar3[uVar12] = this->FallbackAdvanceX;
      }
      uVar12 = uVar12 + 1;
      if (uVar17 == uVar12) {
        return;
      }
    }
  }
  else {
    if (iVar1 < 1) goto LAB_0015e701;
    if (((undefined1  [40])(this->Glyphs).Data[lVar15 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      uVar21 = iVar1 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= iVar1) {
        if (iVar2 == 0) {
          uVar14 = 8;
        }
        else {
          uVar14 = iVar2 / 2 + iVar2;
        }
        if ((int)uVar14 <= (int)uVar21) {
          uVar14 = uVar21;
        }
        if (iVar2 < (int)uVar14) {
          pIVar11 = (ImFontGlyph *)ImGui::MemAlloc((ulong)uVar14 * 0x28);
          pIVar13 = (this->Glyphs).Data;
          if (pIVar13 != (ImFontGlyph *)0x0) {
            memcpy(pIVar11,pIVar13,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar11;
          (this->Glyphs).Capacity = uVar14;
        }
      }
      (this->Glyphs).Size = uVar21;
    }
    lVar15 = (long)(this->Glyphs).Size;
    if (lVar15 < 1) goto LAB_0015e701;
    pIVar13 = (this->Glyphs).Data;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
      pIVar11 = this->FallbackGlyph;
    }
    else {
      pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
    }
    fVar22 = pIVar11->V1;
    pIVar13[lVar15 + -1].U1 = pIVar11->U1;
    pIVar13[lVar15 + -1].V1 = fVar22;
    uVar7 = *(undefined4 *)&pIVar11->field_0x0;
    fVar8 = pIVar11->AdvanceX;
    fVar9 = pIVar11->X0;
    fVar10 = pIVar11->Y0;
    fVar22 = pIVar11->Y1;
    fVar5 = pIVar11->U0;
    fVar6 = pIVar11->V0;
    pIVar13[lVar15 + -1].X1 = pIVar11->X1;
    pIVar13[lVar15 + -1].Y1 = fVar22;
    pIVar13[lVar15 + -1].U0 = fVar5;
    pIVar13[lVar15 + -1].V0 = fVar6;
    *(undefined4 *)&pIVar13[lVar15 + -1].field_0x0 = uVar7;
    pIVar13[lVar15 + -1].AdvanceX = fVar8;
    pIVar13[lVar15 + -1].X0 = fVar9;
    pIVar13[lVar15 + -1].Y0 = fVar10;
    *(uint *)(pIVar13 + lVar15 + -1) = *(uint *)(pIVar13 + lVar15 + -1) & 3 | 0x24;
    fVar22 = pIVar13[lVar15 + -1].AdvanceX * 4.0;
    pIVar13[lVar15 + -1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      if ((this->IndexLookup).Size <= (int)(*(uint *)(pIVar13 + lVar15 + -1) >> 2)) {
LAB_0015e6cb:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_0015e6f7;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar13 + lVar15 + -1) >> 2] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_0015e4a0;
    }
  }
LAB_0015e6b4:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_0015e6f7:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}